

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O2

void Cmd_rebind(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *bind;
  uint key_00;
  FKeyBindings *this;
  
  if (key == 0) {
    Printf("Rebind cannot be used from the console\n");
    return;
  }
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    return;
  }
  this = &DoubleBindings;
  key_00 = key & 0x7fff;
  if (-1 < (short)key) {
    this = &Bindings;
    key_00 = key;
  }
  bind = FCommandLine::operator[](argv,1);
  FKeyBindings::SetBind(this,key_00,bind);
  return;
}

Assistant:

CCMD (rebind)
{
	FKeyBindings *bindings;

	if (key == 0)
	{
		Printf ("Rebind cannot be used from the console\n");
		return;
	}

	if (key & KEY_DBLCLICKED)
	{
		bindings = &DoubleBindings;
		key &= KEY_DBLCLICKED-1;
	}
	else
	{
		bindings = &Bindings;
	}

	if (argv.argc() > 1)
	{
		bindings->SetBind(key, argv[1]);
	}
}